

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

size_t ZDICT_trainFromBuffer
                 (void *dictBuffer,size_t dictBufferCapacity,void *samplesBuffer,
                 size_t *samplesSizes,uint nbSamples)

{
  size_t sVar1;
  ZDICT_fastCover_params_t params;
  ZDICT_fastCover_params_t local_38;
  
  local_38.accel = 0;
  local_38.shrinkDict = 0;
  local_38.nbThreads = 0;
  local_38._20_4_ = 0;
  local_38.splitPoint = 0.0;
  local_38.zParams.notificationLevel = 0;
  local_38.zParams.dictID = 0;
  local_38.k = 0;
  local_38.d = 8;
  local_38.f = 0;
  local_38.steps = 4;
  local_38.shrinkDictMaxRegression = 0;
  local_38.zParams.compressionLevel = 3;
  sVar1 = ZDICT_optimizeTrainFromBuffer_fastCover
                    (dictBuffer,dictBufferCapacity,samplesBuffer,samplesSizes,nbSamples,&local_38);
  return sVar1;
}

Assistant:

size_t ZDICT_trainFromBuffer(void* dictBuffer, size_t dictBufferCapacity,
                             const void* samplesBuffer, const size_t* samplesSizes, unsigned nbSamples)
{
    ZDICT_fastCover_params_t params;
    DEBUGLOG(3, "ZDICT_trainFromBuffer");
    memset(&params, 0, sizeof(params));
    params.d = 8;
    params.steps = 4;
    /* Use default level since no compression level information is available */
    params.zParams.compressionLevel = ZSTD_CLEVEL_DEFAULT;
#if defined(DEBUGLEVEL) && (DEBUGLEVEL>=1)
    params.zParams.notificationLevel = DEBUGLEVEL;
#endif
    return ZDICT_optimizeTrainFromBuffer_fastCover(dictBuffer, dictBufferCapacity,
                                               samplesBuffer, samplesSizes, nbSamples,
                                               &params);
}